

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCurrentTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1122e::TestCanSetAndGetResults::RunImpl(TestCanSetAndGetResults *this)

{
  TestResults *pTVar1;
  bool bVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_70;
  undefined1 local_40 [8];
  TestResults results;
  ScopedCurrentTest scopedTest;
  bool ok;
  TestCanSetAndGetResults *this_local;
  
  ScopedCurrentTest::ScopedCurrentTest((ScopedCurrentTest *)&results.m_failureCount);
  UnitTest::TestResults::TestResults((TestResults *)local_40,(TestReporter *)0x0);
  ppTVar3 = UnitTest::CurrentTest::Results();
  *ppTVar3 = (TestResults *)local_40;
  ppTVar3 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar3;
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)&results.m_failureCount);
  bVar2 = UnitTest::Check<bool>(pTVar1 == (TestResults *)local_40);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_70,*ppTVar4,0x23);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_70,"ok");
  }
  return;
}

Assistant:

TEST(CanSetAndGetResults)
{
	bool ok = false;
	{
		ScopedCurrentTest scopedTest;

		UnitTest::TestResults results;
		UnitTest::CurrentTest::Results() = &results;

		ok = (UnitTest::CurrentTest::Results() == &results);
	}

	CHECK(ok);
}